

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

string_view bloaty::ReadUntilConsuming(string_view *data,char c)

{
  Arg *in_R8;
  string_view sVar1;
  string_view format;
  string local_60;
  char local_40 [8];
  char *local_38;
  char local_30 [32];
  
  sVar1 = ReadUntil(data,c);
  if ((data->_M_len != 0) && (*data->_M_str == c)) {
    data->_M_str = data->_M_str + 1;
    data->_M_len = data->_M_len - 1;
    return sVar1;
  }
  if (c == '\0') {
    Throw("string is not NULL-terminated",0x20);
  }
  local_38 = local_30;
  local_40[0] = '\x01';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  format._M_str = local_40;
  format._M_len = (size_t)"could not find terminating character \'$0\'";
  local_30[0] = c;
  absl::Substitute_abi_cxx11_(&local_60,(absl *)0x29,format,in_R8);
  Throw(local_60._M_dataplus._M_p,0x22);
}

Assistant:

std::string_view ReadUntilConsuming(std::string_view* data, char c) {
  std::string_view ret = ReadUntil(data, c);

  if (data->empty() || data->front() != c) {
    // Nothing left, meaning we didn't find the terminating character.
    if (c == '\0') {
      THROW("string is not NULL-terminated");
    }
    THROWF("could not find terminating character '$0'", c);
  }

  data->remove_prefix(1);  // Remove the terminating character also.
  return ret;
}